

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O0

bool __thiscall
cmMarkAsAdvancedCommand::InitialPass
          (cmMarkAsAdvancedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmState *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  cmake *this_00;
  byte local_169;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  int local_9c;
  cmState *local_98;
  cmState *state;
  string variable;
  char *pcStack_68;
  bool overwrite;
  char *value;
  uint i;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmMarkAsAdvancedCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_005d5ade;
  }
  value._0_4_ = 0;
  pcStack_68 = "1";
  variable.field_2._M_local_buf[0xf] = '\0';
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  bVar2 = std::operator==(pvVar4,"CLEAR");
  if (bVar2) {
LAB_005d5714:
    variable.field_2._M_local_buf[0xf] = '\x01';
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    bVar2 = std::operator==(pvVar4,"CLEAR");
    if (bVar2) {
      pcStack_68 = "0";
    }
    value._0_4_ = 1;
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    bVar2 = std::operator==(pvVar4,"FORCE");
    if (bVar2) goto LAB_005d5714;
  }
  for (; sVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local), (uint)value < sVar3; value._0_4_ = (uint)value + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,(ulong)(uint)value);
    std::__cxx11::string::string((string *)&state,(string *)pvVar4);
    local_98 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    pcVar5 = cmState::GetCacheEntryValue(local_98,(string *)&state);
    if (pcVar5 == (char *)0x0) {
      this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      cmake::AddCacheEntry(this_00,(string *)&state,(char *)0x0,(char *)0x0,6);
      variable.field_2._M_local_buf[0xf] = '\x01';
    }
    pcVar5 = cmState::GetCacheEntryValue(local_98,(string *)&state);
    pcVar1 = local_98;
    if (pcVar5 == (char *)0x0) {
      cmSystemTools::Error("This should never happen...",(char *)0x0,(char *)0x0,(char *)0x0);
      this_local._7_1_ = 0;
      local_9c = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c0,"ADVANCED",&local_c1);
      pcVar5 = cmState::GetCacheEntryProperty(pcVar1,(string *)&state,&local_c0);
      local_169 = 1;
      if (pcVar5 != (char *)0x0) {
        local_169 = variable.field_2._M_local_buf[0xf];
      }
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      pcVar1 = local_98;
      if ((local_169 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e8,"ADVANCED",&local_e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_110,pcStack_68,&local_111);
        cmState::SetCacheEntryProperty(pcVar1,(string *)&state,&local_e8,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      }
      local_9c = 0;
    }
    std::__cxx11::string::~string((string *)&state);
    if (local_9c != 0) goto LAB_005d5ade;
  }
  this_local._7_1_ = 1;
LAB_005d5ade:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMarkAsAdvancedCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  unsigned int i =0;
  const char* value = "1";
  bool overwrite = false;
  if(args[0] == "CLEAR" || args[0] == "FORCE")
    {
    overwrite = true;
    if(args[0] == "CLEAR")
      {
      value = "0";
      }
    i = 1;
    }
  for(; i < args.size(); ++i)
    {
    std::string variable = args[i];
    cmState* state = this->Makefile->GetState();
    if (!state->GetCacheEntryValue(variable))
      {
      this->Makefile->GetCMakeInstance()->AddCacheEntry(
              variable, 0, 0, cmState::UNINITIALIZED);
      overwrite = true;
      }
    if (!state->GetCacheEntryValue(variable))
      {
      cmSystemTools::Error("This should never happen...");
      return false;
      }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite)
      {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
      }
    }
  return true;
}